

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

fy_anchor * fy_document_lookup_anchor_by_token(fy_document *fyd,fy_token *anchor)

{
  _Bool _Var1;
  int iVar2;
  fy_input *pfVar3;
  fy_input *pfVar4;
  size_t sVar5;
  size_t sVar6;
  int local_64;
  size_t sStack_60;
  int count;
  size_t text_len;
  size_t anchor_len;
  char *text;
  char *anchor_text;
  fy_anchor_list *fyal;
  fy_anchor *fya_found2;
  fy_anchor *fya_found;
  fy_anchor *fya;
  fy_token *anchor_local;
  fy_document *fyd_local;
  
  if ((fyd == (fy_document *)0x0) || (anchor == (fy_token *)0x0)) {
    return (fy_anchor *)0x0;
  }
  fya = (fy_anchor *)anchor;
  anchor_local = (fy_token *)fyd;
  _Var1 = fy_document_is_accelerated(fyd);
  if (_Var1) {
    fya_found = fy_document_accel_lookup_anchor_by_token
                          ((fy_document *)anchor_local,(fy_token *)fya);
    if (fya_found == (fy_anchor *)0x0) {
      return (fy_anchor *)0x0;
    }
    if ((fya_found->field_0x20 & 1) == 0) {
      return fya_found;
    }
  }
  text = fy_token_get_text((fy_token *)fya,&text_len);
  if (text == (char *)0x0) {
    fyd_local = (fy_document *)0x0;
  }
  else {
    anchor_text = (char *)&anchor_local->type;
    local_64 = 0;
    fya_found2 = (fy_anchor *)0x0;
    for (fya_found = fy_anchor_list_head((fy_anchor_list *)anchor_text);
        fya_found != (fy_anchor *)0x0;
        fya_found = fy_anchor_next((fy_anchor_list *)anchor_text,fya_found)) {
      anchor_len = (size_t)fy_anchor_get_text(fya_found,&stack0xffffffffffffffa0);
      if ((char *)anchor_len == (char *)0x0) {
        return (fy_anchor *)0x0;
      }
      if ((text_len == sStack_60) && (iVar2 = memcmp(text,(void *)anchor_len,text_len), iVar2 == 0))
      {
        local_64 = local_64 + 1;
        fya_found2 = fya_found;
      }
    }
    if (local_64 == 0) {
      fyd_local = (fy_document *)0x0;
    }
    else if (local_64 == 1) {
      fyd_local = (fy_document *)fya_found2;
    }
    else {
      fyal = (fy_anchor_list *)0x0;
      for (fya_found = fy_anchor_list_head((fy_anchor_list *)anchor_text);
          fya_found != (fy_anchor *)0x0;
          fya_found = fy_anchor_next((fy_anchor_list *)anchor_text,fya_found)) {
        pfVar3 = fy_token_get_input(fya_found->anchor);
        pfVar4 = fy_token_get_input((fy_token *)fya);
        if (pfVar3 == pfVar4) {
          anchor_len = (size_t)fy_anchor_get_text(fya_found,&stack0xffffffffffffffa0);
          if ((char *)anchor_len == (char *)0x0) {
            return (fy_anchor *)0x0;
          }
          if ((text_len == sStack_60) &&
             (iVar2 = memcmp(text,(void *)anchor_len,text_len), iVar2 == 0)) {
            sVar5 = fy_token_start_pos(fya_found->anchor);
            sVar6 = fy_token_start_pos((fy_token *)fya);
            if (sVar5 < sVar6) {
              fyal = (fy_anchor_list *)fya_found;
            }
          }
        }
      }
      if (fyal == (fy_anchor_list *)0x0) {
        fyd_local = (fy_document *)fya_found2;
      }
      else {
        fyd_local = (fy_document *)fyal;
      }
    }
  }
  return (fy_anchor *)fyd_local;
}

Assistant:

struct fy_anchor *
fy_document_lookup_anchor_by_token(struct fy_document *fyd,
                                   struct fy_token *anchor) {
    struct fy_anchor *fya, *fya_found, *fya_found2;
    struct fy_anchor_list *fyal;
    const char *anchor_text, *text;
    size_t anchor_len, text_len;
    int count;

    if (!fyd || !anchor)
        return NULL;

    /* first try direct match (it's faster and the common case) */
    if (fy_document_is_accelerated(fyd)) {
        fya = fy_document_accel_lookup_anchor_by_token(fyd, anchor);
        if (!fya)
            return NULL;

        /* single anchor? return it */
        if (!fya->multiple)
            return fya;

        /* multiple anchors, fall-through */
    }

    anchor_text = fy_token_get_text(anchor, &anchor_len);
    if (!anchor_text)
        return NULL;

    fyal = &fyd->anchors;

    /* first pass, try with a single match */
    count = 0;
    fya_found = NULL;
    for (fya = fy_anchor_list_head(fyal); fya; fya = fy_anchor_next(fyal, fya)) {
        text = fy_anchor_get_text(fya, &text_len);
        if (!text)
            return NULL;

        if (anchor_len == text_len && !memcmp(anchor_text, text, anchor_len)) {
            count++;
            fya_found = fya;
        }
    }

    /* not found */
    if (!count)
        return NULL;

    /* single one? fine */
    if (count == 1)
        return fya_found;

    /* multiple ones, must pick the one that's the last one before
	 * the requesting token */
    /* fyd_notice(fyd, "multiple anchors for %.*s", (int)anchor_len, anchor_text); */

    /* only try the ones on the same input
	 * we don't try to cover the case where the label is referenced
	 * by other constructed documents
	 */
    fya_found2 = NULL;
    for (fya = fy_anchor_list_head(fyal); fya; fya = fy_anchor_next(fyal, fya)) {

        /* only on the same input */
        if (fy_token_get_input(fya->anchor) != fy_token_get_input(anchor))
            continue;

        text = fy_anchor_get_text(fya, &text_len);
        if (!text)
            return NULL;

        if (anchor_len == text_len && !memcmp(anchor_text, text, anchor_len) &&
            fy_token_start_pos(fya->anchor) < fy_token_start_pos(anchor)) {
            fya_found2 = fya;
        }
    }

    /* just return the one find earlier */
    if (!fya_found2)
        return fya_found;

    /* return the one that was the latest */
    return fya_found2;
}